

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

SyntaxNode * __thiscall
slang::syntax::DeepCloneVisitor::visit<slang::syntax::OneStepDelaySyntax>
          (DeepCloneVisitor *this,OneStepDelaySyntax *node,BumpAllocator *alloc)

{
  int iVar1;
  undefined4 extraout_var;
  void *in_RCX;
  int in_EDX;
  undefined4 in_register_00000014;
  __fn *in_RSI;
  
  iVar1 = deep::clone(in_RSI,(void *)CONCAT44(in_register_00000014,in_EDX),in_EDX,in_RCX);
  return (SyntaxNode *)CONCAT44(extraout_var,iVar1);
}

Assistant:

SyntaxNode* visit(const T& node, BumpAllocator& alloc) {
        return deep::clone(node, alloc);
    }